

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportBuildAndroidMKGenerator.cxx
# Opt level: O3

void cmExportBuildAndroidMKGenerator::GenerateInterfaceProperties
               (cmGeneratorTarget *target,ostream *os,ImportPropertyMap *properties,
               GenerateType type,string *config)

{
  cmMakefile *this;
  auto_ptr<cmCompiledGeneratorExpression> this_00;
  bool bVar1;
  PolicyStatus PVar2;
  int iVar3;
  TargetType TVar4;
  ostream *poVar5;
  cmLocalGenerator *pcVar6;
  cmGeneratorTarget *this_01;
  _Base_ptr p_Var7;
  cmLinkImplementation *pcVar8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var9;
  _Base_ptr p_Var10;
  pointer pbVar11;
  char *pcVar12;
  bool bVar13;
  string local_290;
  string end;
  allocator local_249;
  _Base_ptr local_248;
  GenerateType local_23c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includeList;
  cmGeneratorExpression ge;
  auto_ptr<cmCompiledGeneratorExpression> cge;
  string evaluated;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  libraries;
  ostringstream w;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  
  local_23c = type;
  PVar2 = cmPolicies::PolicyMap::Get(&target->PolicyMap,CMP0022);
  if ((PVar2 == WARN) ||
     (PVar2 = cmPolicies::PolicyMap::Get(&target->PolicyMap,CMP0022), PVar2 == OLD)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&w);
    pcVar12 = "install( EXPORT_ANDROID_MK ...) called with policy CMP0022";
    if (local_23c == BUILD) {
      pcVar12 = "export(TARGETS ... ANDROID_MK) called with policy CMP0022";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&w,pcVar12,(ulong)(local_23c != BUILD) + 0x39);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&w," set to OLD for target ",0x17)
    ;
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&w,(target->Target->Name)._M_dataplus._M_p,
                        (target->Target->Name)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,". ",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"The export will only work with CMP0022 set to NEW.",0x32);
    this = target->Makefile;
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(this,AUTHOR_WARNING,&end);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)end._M_dataplus._M_p != &end.field_2) {
      operator_delete(end._M_dataplus._M_p,
                      CONCAT71(end.field_2._M_allocated_capacity._1_7_,end.field_2._M_local_buf[0])
                      + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&w);
    std::ios_base::~ios_base(local_138);
  }
  if ((properties->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              (os,"LOCAL_CPP_FEATURES := rtti exceptions\n",0x26);
    for (p_Var7 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var7 != &(properties->_M_t)._M_impl.super__Rb_tree_header;
        p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
      p_Var10 = p_Var7 + 1;
      iVar3 = std::__cxx11::string::compare((char *)p_Var10);
      if (iVar3 == 0) {
        std::__ostream_insert<char,std::char_traits<char>>(os,"LOCAL_CPP_FEATURES += ",0x16);
        pcVar12 = *(char **)(p_Var7 + 2);
        p_Var10 = p_Var7[2]._M_parent;
        poVar5 = os;
LAB_00337a15:
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar12,(long)p_Var10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      }
      else {
        local_248 = p_Var7;
        iVar3 = std::__cxx11::string::compare((char *)p_Var10);
        if (iVar3 == 0) {
          libraries.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          libraries.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          libraries.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          cmSystemTools::ExpandListArgument((string *)(local_248 + 2),&libraries,false);
          _w = (pointer)local_198;
          local_198[0]._M_local_buf[0] = '\0';
          end._M_dataplus._M_p = (pointer)&end.field_2;
          end._M_string_length = 0;
          end.field_2._M_local_buf[0] = '\0';
          includeList.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)&includeList.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
          includeList.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          includeList.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)((ulong)includeList.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage &
                        0xffffffffffffff00);
          pbVar11 = libraries.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (libraries.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              libraries.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            do {
              pcVar6 = cmGeneratorTarget::GetLocalGenerator(target);
              this_01 = cmLocalGenerator::FindGeneratorTargetToUse(pcVar6,pbVar11);
              if (this_01 == (cmGeneratorTarget *)0x0) {
                cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)&evaluated);
                cmGeneratorExpression::cmGeneratorExpression(&ge,(cmListFileBacktrace *)&evaluated);
                cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&evaluated);
                cmGeneratorExpression::Parse((cmGeneratorExpression *)&evaluated,(string *)&ge);
                cge.x_ = (cmCompiledGeneratorExpression *)evaluated._M_dataplus;
                evaluated._M_dataplus._M_p = (pointer)0x0;
                ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
                          ((auto_ptr<cmCompiledGeneratorExpression> *)&evaluated);
                this_00 = cge;
                pcVar6 = cmGeneratorTarget::GetLocalGenerator(target);
                local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
                local_290._M_string_length = 0;
                local_290.field_2._M_local_buf[0] = '\0';
                pcVar12 = cmCompiledGeneratorExpression::Evaluate
                                    (this_00.x_,pcVar6,config,false,(cmGeneratorTarget *)0x0,
                                     (cmGeneratorTarget *)0x0,(cmGeneratorExpressionDAGChecker *)0x0
                                     ,&local_290);
                std::__cxx11::string::string((string *)&evaluated,pcVar12,&local_249);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_290._M_dataplus._M_p != &local_290.field_2) {
                  operator_delete(local_290._M_dataplus._M_p,
                                  CONCAT71(local_290.field_2._M_allocated_capacity._1_7_,
                                           local_290.field_2._M_local_buf[0]) + 1);
                }
                if (local_23c == INSTALL) {
                  std::__cxx11::string::substr((ulong)&local_290,(ulong)pbVar11);
                  iVar3 = std::__cxx11::string::compare((char *)&local_290);
                  bVar13 = iVar3 == 0;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_290._M_dataplus._M_p != &local_290.field_2) {
                    operator_delete(local_290._M_dataplus._M_p,
                                    CONCAT71(local_290.field_2._M_allocated_capacity._1_7_,
                                             local_290.field_2._M_local_buf[0]) + 1);
                  }
                }
                else {
                  bVar13 = false;
                }
                bVar1 = cmsys::SystemTools::FileIsFullPath(&evaluated);
                if (bVar1) {
LAB_00337cc8:
                  std::operator+(&local_290," ",&evaluated);
                  std::__cxx11::string::_M_append
                            ((char *)&includeList,(ulong)local_290._M_dataplus._M_p);
LAB_00337cf5:
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_290._M_dataplus._M_p != &local_290.field_2) {
                    operator_delete(local_290._M_dataplus._M_p,
                                    CONCAT71(local_290.field_2._M_allocated_capacity._1_7_,
                                             local_290.field_2._M_local_buf[0]) + 1);
                  }
                }
                else {
                  std::__cxx11::string::substr((ulong)&local_290,(ulong)&evaluated);
                  iVar3 = std::__cxx11::string::compare((char *)&local_290);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_290._M_dataplus._M_p != &local_290.field_2) {
                    operator_delete(local_290._M_dataplus._M_p,
                                    CONCAT71(local_290.field_2._M_allocated_capacity._1_7_,
                                             local_290.field_2._M_local_buf[0]) + 1);
                  }
                  if (bVar13 || iVar3 == 0) goto LAB_00337cc8;
                  if (evaluated._M_string_length != 0) {
                    std::operator+(&local_290," -l",&evaluated);
                    std::__cxx11::string::_M_append
                              ((char *)&includeList,(ulong)local_290._M_dataplus._M_p);
                    goto LAB_00337cf5;
                  }
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)evaluated._M_dataplus._M_p != &evaluated.field_2) {
                  operator_delete(evaluated._M_dataplus._M_p,
                                  evaluated.field_2._M_allocated_capacity + 1);
                }
                ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&cge);
                cmGeneratorExpression::~cmGeneratorExpression(&ge);
              }
              else {
                TVar4 = cmGeneratorTarget::GetType(this_01);
                if ((TVar4 == SHARED_LIBRARY) ||
                   (TVar4 = cmGeneratorTarget::GetType(this_01), TVar4 == MODULE_LIBRARY)) {
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&ge," ",pbVar11);
                  std::__cxx11::string::_M_append((char *)&end,(ulong)ge.Backtrace.Bottom.State);
                }
                else {
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&ge," ",pbVar11);
                  std::__cxx11::string::_M_append((char *)&w,(ulong)ge.Backtrace.Bottom.State);
                }
                if (ge.Backtrace.Bottom.State != (cmState *)&ge.Backtrace.Bottom.Position.Position)
                {
                  operator_delete(ge.Backtrace.Bottom.State,
                                  ge.Backtrace.Bottom.Position.Position + 1);
                }
              }
              pbVar11 = pbVar11 + 1;
            } while (pbVar11 !=
                     libraries.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
            if (end._M_string_length != 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        (os,"LOCAL_SHARED_LIBRARIES :=",0x19);
              poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                 (os,end._M_dataplus._M_p,end._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
            }
          }
          if (includeList.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
            std::__ostream_insert<char,std::char_traits<char>>(os,"LOCAL_EXPORT_LDLIBS :=",0x16);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               (os,(char *)includeList.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start,
                                (long)includeList.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
          }
          if (includeList.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              (pointer)&includeList.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            operator_delete(includeList.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (ulong)((long)&((includeList.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                           _M_dataplus)._M_p + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)end._M_dataplus._M_p != &end.field_2) {
            operator_delete(end._M_dataplus._M_p,
                            CONCAT71(end.field_2._M_allocated_capacity._1_7_,
                                     end.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_w != local_198) {
            operator_delete(_w,CONCAT71(local_198[0]._M_allocated_capacity._1_7_,
                                        local_198[0]._M_local_buf[0]) + 1);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&libraries);
          p_Var7 = local_248;
        }
        else {
          iVar3 = std::__cxx11::string::compare((char *)p_Var10);
          if (iVar3 != 0) {
            std::__ostream_insert<char,std::char_traits<char>>(os,"# ",2);
            p_Var7 = local_248;
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               (os,*(char **)(local_248 + 1),(long)local_248[1]._M_parent);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
            pcVar12 = *(char **)(p_Var7 + 2);
            p_Var10 = p_Var7[2]._M_parent;
            goto LAB_00337a15;
          }
          _w = (pointer)local_198;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&w,*(long *)(local_248 + 2),
                     (long)&(local_248[2]._M_parent)->_M_color + *(long *)(local_248 + 2));
          includeList.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          includeList.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          includeList.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          cmSystemTools::ExpandListArgument((string *)&w,&includeList,false);
          std::__ostream_insert<char,std::char_traits<char>>(os,"LOCAL_EXPORT_C_INCLUDES := ",0x1b);
          end._M_dataplus._M_p = (pointer)&end.field_2;
          end._M_string_length = 0;
          end.field_2._M_local_buf[0] = '\0';
          pbVar11 = includeList.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (includeList.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              includeList.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            do {
              poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                 (os,end._M_dataplus._M_p,end._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar5,(pbVar11->_M_dataplus)._M_p,pbVar11->_M_string_length);
              std::__cxx11::string::_M_replace((ulong)&end,0,(char *)end._M_string_length,0x59213e);
              pbVar11 = pbVar11 + 1;
            } while (pbVar11 !=
                     includeList.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
          }
          std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)end._M_dataplus._M_p != &end.field_2) {
            operator_delete(end._M_dataplus._M_p,
                            CONCAT71(end.field_2._M_allocated_capacity._1_7_,
                                     end.field_2._M_local_buf[0]) + 1);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&includeList);
          p_Var7 = local_248;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_w != local_198) {
            operator_delete(_w,CONCAT71(local_198[0]._M_allocated_capacity._1_7_,
                                        local_198[0]._M_local_buf[0]) + 1);
            p_Var7 = local_248;
          }
        }
      }
    }
  }
  TVar4 = cmGeneratorTarget::GetType(target);
  if (TVar4 == STATIC_LIBRARY) {
    pcVar8 = cmGeneratorTarget::GetLinkImplementation(target,config);
    _Var9 = std::
            __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[4]>>
                      ((pcVar8->Languages).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (pcVar8->Languages).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,"CXX");
    if (_Var9._M_current !=
        (pcVar8->Languages).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::__ostream_insert<char,std::char_traits<char>>(os,"LOCAL_HAS_CPP := true\n",0x16);
    }
  }
  TVar4 = cmGeneratorTarget::GetType(target);
  if (TVar4 - STATIC_LIBRARY < 3) {
    std::__ostream_insert<char,std::char_traits<char>>
              (os,&DAT_00566414 + *(int *)(&DAT_00566414 + (ulong)(TVar4 - STATIC_LIBRARY) * 4),0x23
              );
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
  return;
}

Assistant:

void cmExportBuildAndroidMKGenerator::GenerateInterfaceProperties(
  const cmGeneratorTarget* target, std::ostream& os,
  const ImportPropertyMap& properties, GenerateType type,
  std::string const& config)
{
  const bool newCMP0022Behavior =
    target->GetPolicyStatusCMP0022() != cmPolicies::WARN &&
    target->GetPolicyStatusCMP0022() != cmPolicies::OLD;
  if (!newCMP0022Behavior) {
    std::ostringstream w;
    if (type == cmExportBuildAndroidMKGenerator::BUILD) {
      w << "export(TARGETS ... ANDROID_MK) called with policy CMP0022";
    } else {
      w << "install( EXPORT_ANDROID_MK ...) called with policy CMP0022";
    }
    w << " set to OLD for target " << target->Target->GetName() << ". "
      << "The export will only work with CMP0022 set to NEW.";
    target->Makefile->IssueMessage(cmake::AUTHOR_WARNING, w.str());
  }
  if (!properties.empty()) {
    os << "LOCAL_CPP_FEATURES := rtti exceptions\n";
    for (ImportPropertyMap::const_iterator pi = properties.begin();
         pi != properties.end(); ++pi) {
      if (pi->first == "INTERFACE_COMPILE_OPTIONS") {
        os << "LOCAL_CPP_FEATURES += ";
        os << (pi->second) << "\n";
      } else if (pi->first == "INTERFACE_LINK_LIBRARIES") {
        // need to look at list in pi->second and see if static or shared
        // FindTargetToLink
        // target->GetLocalGenerator()->FindGeneratorTargetToUse()
        // then add to LOCAL_CPPFLAGS
        std::vector<std::string> libraries;
        cmSystemTools::ExpandListArgument(pi->second, libraries);
        std::string staticLibs;
        std::string sharedLibs;
        std::string ldlibs;
        for (std::vector<std::string>::iterator i = libraries.begin();
             i != libraries.end(); ++i) {
          cmGeneratorTarget* gt =
            target->GetLocalGenerator()->FindGeneratorTargetToUse(*i);
          if (gt) {

            if (gt->GetType() == cmStateEnums::SHARED_LIBRARY ||
                gt->GetType() == cmStateEnums::MODULE_LIBRARY) {
              sharedLibs += " " + *i;
            } else {
              staticLibs += " " + *i;
            }
          } else {
            // evaluate any generator expressions with the current
            // build type of the makefile
            cmGeneratorExpression ge;
            CM_AUTO_PTR<cmCompiledGeneratorExpression> cge = ge.Parse(*i);
            std::string evaluated =
              cge->Evaluate(target->GetLocalGenerator(), config);
            bool relpath = false;
            if (type == cmExportBuildAndroidMKGenerator::INSTALL) {
              relpath = i->substr(0, 3) == "../";
            }
            // check for full path or if it already has a -l, or
            // in the case of an install check for relative paths
            // if it is full or a link library then use string directly
            if (cmSystemTools::FileIsFullPath(evaluated) ||
                evaluated.substr(0, 2) == "-l" || relpath) {
              ldlibs += " " + evaluated;
              // if it is not a path and does not have a -l then add -l
            } else if (!evaluated.empty()) {
              ldlibs += " -l" + evaluated;
            }
          }
        }
        if (!sharedLibs.empty()) {
          os << "LOCAL_SHARED_LIBRARIES :=" << sharedLibs << "\n";
        }
        if (!staticLibs.empty()) {
          os << "LOCAL_STATIC_LIBRARIES :=" << staticLibs << "\n";
        }
        if (!ldlibs.empty()) {
          os << "LOCAL_EXPORT_LDLIBS :=" << ldlibs << "\n";
        }
      } else if (pi->first == "INTERFACE_INCLUDE_DIRECTORIES") {
        std::string includes = pi->second;
        std::vector<std::string> includeList;
        cmSystemTools::ExpandListArgument(includes, includeList);
        os << "LOCAL_EXPORT_C_INCLUDES := ";
        std::string end;
        for (std::vector<std::string>::iterator i = includeList.begin();
             i != includeList.end(); ++i) {
          os << end << *i;
          end = "\\\n";
        }
        os << "\n";
      } else {
        os << "# " << pi->first << " " << (pi->second) << "\n";
      }
    }
  }

  // Tell the NDK build system if prebuilt static libraries use C++.
  if (target->GetType() == cmStateEnums::STATIC_LIBRARY) {
    cmLinkImplementation const* li = target->GetLinkImplementation(config);
    if (std::find(li->Languages.begin(), li->Languages.end(), "CXX") !=
        li->Languages.end()) {
      os << "LOCAL_HAS_CPP := true\n";
    }
  }

  switch (target->GetType()) {
    case cmStateEnums::SHARED_LIBRARY:
    case cmStateEnums::MODULE_LIBRARY:
      os << "include $(PREBUILT_SHARED_LIBRARY)\n";
      break;
    case cmStateEnums::STATIC_LIBRARY:
      os << "include $(PREBUILT_STATIC_LIBRARY)\n";
      break;
    case cmStateEnums::EXECUTABLE:
    case cmStateEnums::UTILITY:
    case cmStateEnums::OBJECT_LIBRARY:
    case cmStateEnums::GLOBAL_TARGET:
    case cmStateEnums::INTERFACE_LIBRARY:
    case cmStateEnums::UNKNOWN_LIBRARY:
      break;
  }
  os << "\n";
}